

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRError.h
# Opt level: O0

void __thiscall
MinVR::VRError::VRError
          (VRError *this,string *whatMsg,string *adviceMsg,string *whereFile,int *whereLine,
          string *whereFunc)

{
  ostream *this_00;
  string *in_RCX;
  string *in_RDX;
  string *in_RSI;
  exception *in_RDI;
  int *in_R8;
  string *in_R9;
  stringstream ss;
  string local_208 [32];
  string local_1e8 [16];
  VRError *in_stack_fffffffffffffe28;
  stringstream local_1c8 [16];
  undefined1 local_1b8 [392];
  string *local_30;
  int *local_28;
  string *local_20;
  string *local_18;
  string *local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::exception::exception(in_RDI);
  *(undefined ***)in_RDI = &PTR__VRError_0014c1a0;
  std::__cxx11::string::string((string *)(in_RDI + 8),local_10);
  std::__cxx11::string::string((string *)(in_RDI + 0x28),local_18);
  std::__cxx11::string::string((string *)(in_RDI + 0x48),local_20);
  std::__cxx11::string::string((string *)(in_RDI + 0x68),local_30);
  std::__cxx11::string::string((string *)(in_RDI + 0x88));
  std::__cxx11::stringstream::stringstream(local_1c8);
  std::ostream::operator<<(local_1b8,*local_28);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)(in_RDI + 0x88),local_1e8);
  std::__cxx11::string::~string(local_1e8);
  _errorMessage_abi_cxx11_(in_stack_fffffffffffffe28);
  this_00 = std::operator<<((ostream *)&std::cerr,local_208);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_208);
  std::__cxx11::stringstream::~stringstream(local_1c8);
  return;
}

Assistant:

VRError(const std::string& whatMsg,
         const std::string& adviceMsg = "",
         const std::string& whereFile = "",
         const int& whereLine = 0,
         const std::string& whereFunc = ""):
  _whatMsg(whatMsg), _adviceMsg(adviceMsg),
    _whereFile(whereFile), _whereFunc(whereFunc) {

    // Convert the line number to a string.
    std::stringstream ss; ss << whereLine; _whereLine = ss.str();
	std::cerr << _errorMessage() << std::endl;
  }